

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

void __thiscall
testing::internal::
scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::reset
          (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  bool bVar3;
  
  if (this->ptr_ != p) {
    bVar3 = IsTrue(true);
    if (bVar3) {
      pbVar1 = this->ptr_;
      if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
         (pcVar2 = (pbVar1->_M_dataplus)._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar2 != &pbVar1->field_2)) {
        operator_delete(pcVar2);
      }
      operator_delete(pbVar1);
    }
    this->ptr_ = p;
  }
  return;
}

Assistant:

void reset(T* p = nullptr) {
    if (p != ptr_) {
      if (IsTrue(sizeof(T) > 0)) {  // Makes sure T is a complete type.
        delete ptr_;
      }
      ptr_ = p;
    }
  }